

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_cdef(AV1_COMMON *cm,MACROBLOCKD *xd,aom_writer *w,int skip)

{
  uint uVar1;
  int iVar2;
  int in_ECX;
  uint *in_RSI;
  long in_RDI;
  MB_MODE_INFO *mbmi;
  int grid_idx;
  CommonModeInfoParams *mi_params;
  int first_block_mask;
  int index;
  int cdef_unit_col_in_sb;
  int cdef_unit_row_in_sb;
  int index_mask;
  int cdef_size;
  int mi_col_in_sb;
  int mi_row_in_sb;
  int sb_mask;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar3;
  
  if (((*(byte *)(in_RDI + 499) & 1) == 0) && ((*(byte *)(in_RDI + 0x1f0) & 1) == 0)) {
    uVar1 = *(int *)(*(long *)(in_RDI + 0x6088) + 0x20) - 1;
    if (((*in_RSI & uVar1) == 0) && ((in_RSI[1] & uVar1) == 0)) {
      *(undefined1 *)(in_RSI + 0xa82) = 0;
      *(undefined1 *)((long)in_RSI + 0x2a07) = 0;
      *(undefined1 *)((long)in_RSI + 0x2a06) = 0;
      *(undefined1 *)((long)in_RSI + 0x2a05) = 0;
    }
    if (*(char *)(*(long *)(in_RDI + 0x6088) + 0x1c) == '\x0f') {
      iVar2 = (uint)((in_RSI[1] & 0x10) != 0) + (uint)((*in_RSI & 0x10) != 0) * 2;
    }
    else {
      iVar2 = 0;
    }
    if (((*(byte *)((long)in_RSI + (long)iVar2 + 0x2a05) & 1) == 0) && (in_ECX == 0)) {
      iVar3 = iVar2;
      get_mi_grid_idx((CommonModeInfoParams *)(in_RDI + 0x208),*in_RSI & 0xfffffff0,
                      in_RSI[1] & 0xfffffff0);
      aom_write_literal((aom_writer *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      *(undefined1 *)((long)in_RSI + (long)iVar2 + 0x2a05) = 1;
    }
  }
  return;
}

Assistant:

static inline void write_cdef(AV1_COMMON *cm, MACROBLOCKD *const xd,
                              aom_writer *w, int skip) {
  if (cm->features.coded_lossless || cm->features.allow_intrabc) return;

  // At the start of a superblock, mark that we haven't yet written CDEF
  // strengths for any of the CDEF units contained in this superblock.
  const int sb_mask = (cm->seq_params->mib_size - 1);
  const int mi_row_in_sb = (xd->mi_row & sb_mask);
  const int mi_col_in_sb = (xd->mi_col & sb_mask);
  if (mi_row_in_sb == 0 && mi_col_in_sb == 0) {
    xd->cdef_transmitted[0] = xd->cdef_transmitted[1] =
        xd->cdef_transmitted[2] = xd->cdef_transmitted[3] = false;
  }

  // CDEF unit size is 64x64 irrespective of the superblock size.
  const int cdef_size = 1 << (6 - MI_SIZE_LOG2);

  // Find index of this CDEF unit in this superblock.
  const int index_mask = cdef_size;
  const int cdef_unit_row_in_sb = ((xd->mi_row & index_mask) != 0);
  const int cdef_unit_col_in_sb = ((xd->mi_col & index_mask) != 0);
  const int index = (cm->seq_params->sb_size == BLOCK_128X128)
                        ? cdef_unit_col_in_sb + 2 * cdef_unit_row_in_sb
                        : 0;

  // Write CDEF strength to the first non-skip coding block in this CDEF unit.
  if (!xd->cdef_transmitted[index] && !skip) {
    // CDEF strength for this CDEF unit needs to be stored in the MB_MODE_INFO
    // of the 1st block in this CDEF unit.
    const int first_block_mask = ~(cdef_size - 1);
    const CommonModeInfoParams *const mi_params = &cm->mi_params;
    const int grid_idx =
        get_mi_grid_idx(mi_params, xd->mi_row & first_block_mask,
                        xd->mi_col & first_block_mask);
    const MB_MODE_INFO *const mbmi = mi_params->mi_grid_base[grid_idx];
    aom_write_literal(w, mbmi->cdef_strength, cm->cdef_info.cdef_bits);
    xd->cdef_transmitted[index] = true;
  }
}